

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

CProgramPtr __thiscall
CSourceFilesProcessor::Compile(CSourceFilesProcessor *this,CFileNames *fileNames)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CProgramPtr CVar1;
  undefined1 local_21b8 [8];
  CSourceFilesProcessor sourceFilesProcessor;
  CFileNames *fileNames_local;
  
  sourceFilesProcessor._8600_8_ = fileNames;
  CSourceFilesProcessor((CSourceFilesProcessor *)local_21b8,fileNames);
  Refal2::CProgramBuilder::BuildProgram((CProgramBuilder *)this);
  ~CSourceFilesProcessor((CSourceFilesProcessor *)local_21b8);
  CVar1.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (CProgramPtr)CVar1.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CProgramPtr CSourceFilesProcessor::Compile( const CFileNames& fileNames )
{
	CSourceFilesProcessor sourceFilesProcessor( fileNames );
	return sourceFilesProcessor.scanner.BuildProgram();
}